

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::replace_fragment_outputs(CompilerGLSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  long lVar7;
  LoopLock loop_lock;
  LoopLock LStack_38;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        pSVar6 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(var->super_IVariant).field_0xc);
        bVar5 = Compiler::is_builtin_variable(&this->super_Compiler,var);
        if ((((!bVar5) && (var->remapped_variable == false)) && (pSVar6->pointer == true)) &&
           (var->storage == StorageClassOutput)) {
          replace_fragment_output(this,var);
        }
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_38);
  return;
}

Assistant:

void CompilerGLSL::replace_fragment_outputs()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		if (!is_builtin_variable(var) && !var.remapped_variable && type.pointer && var.storage == StorageClassOutput)
			replace_fragment_output(var);
	});
}